

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Client * __thiscall
capnp::Orphan<capnp::DynamicCapability>::get
          (Client *__return_storage_ptr__,Orphan<capnp::DynamicCapability> *this)

{
  RawBrandedSchema *pRVar1;
  word local_28;
  SegmentBuilder *local_20;
  
  pRVar1 = (this->schema).super_Schema.raw;
  _::OrphanBuilder::asCapability((OrphanBuilder *)&local_28);
  (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)local_28.content;
  (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)local_20;
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicCapability::Client Orphan<DynamicCapability>::get() {
  return DynamicCapability::Client(schema, builder.asCapability());
}